

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O2

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::precision(ConfusionMatrix<int,_1> *this,int class_)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  for (p_Var1 = (this->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->cm)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(int *)&p_Var1[1].field_0x4 == class_) {
      iVar2 = *(int *)&p_Var1[1]._M_parent;
      iVar3 = iVar3 + iVar2;
      if (p_Var1[1]._M_color != class_) {
        iVar2 = 0;
      }
      iVar4 = iVar4 + iVar2;
    }
  }
  return (double)iVar4 / (double)iVar3;
}

Assistant:

double precision(C class_) {
        int hypothesis_total_results = 0;
        int hypothesis_true_results = 0;
        for (auto p : cm) {
            auto actual = p.first.first;
            auto predicted = p.first.second;
            auto count = p.second;
            if (predicted == class_) {
                hypothesis_total_results += count;
                if (predicted == actual) {
                    hypothesis_true_results += count;
                }
            }
        }
        return 1.0 * hypothesis_true_results / hypothesis_total_results;
    }